

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCatalog.cpp
# Opt level: O0

bool __thiscall psy::C::NameCatalog::hasDefAs_CORE<0ul>(NameCatalog *this,string *name)

{
  bool bVar1;
  Enclosure *__t;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
  local_38;
  const_iterator iter;
  __tuple_element_t<0UL,_tuple<unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>,_unordered_map<basic_string<char>,_pair<bool,_unsigned_long>,_hash<string>,_equal_to<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_pair<bool,_unsigned_long>_>_>_>_>_>
  *useAndDef;
  Enclosure *enclosure;
  string *name_local;
  NameCatalog *this_local;
  
  __t = currentEnclosure_abi_cxx11_(this);
  iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
             )std::
              get<0ul,std::unordered_map<std::__cxx11::string,std::pair<bool,unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>>,std::unordered_map<std::__cxx11::string,std::pair<bool,unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,unsigned_long>>>>>
                        (__t);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>
               *)iter.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
                 ._M_cur,name);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>
       ::end(iter.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_true>
             ._M_cur);
  bVar1 = std::__detail::operator==(&local_38,&local_40);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>,_false,_true>
                           *)&local_38);
    this_local._7_1_ = (bool)((pvVar2->second).first & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool NameCatalog::hasDefAs_CORE(const std::string& name) const
{
    auto enclosure = currentEnclosure();
    const auto& useAndDef = std::get<idx>(*enclosure);
    auto iter = useAndDef.find(name);
    if (iter == useAndDef.end())
        return false;
    return iter->second.first;
}